

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

NAMED * lookup(XML_Parser parser,HASH_TABLE *table,KEY name,size_t createSize)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  unsigned_long uVar4;
  NAMED *pNVar5;
  NAMED **ppNVar6;
  unsigned_long uVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  char cVar11;
  size_t sVar12;
  byte bVar13;
  long lVar14;
  size_t sVar15;
  ulong unaff_R15;
  ulong uVar16;
  
  if (table->size == 0) {
    if (createSize == 0) {
LAB_005f8629:
      bVar3 = false;
    }
    else {
      table->power = '\x06';
      table->size = 0x40;
      ppNVar6 = (NAMED **)(*table->mem->malloc_fcn)(0x200);
      table->v = ppNVar6;
      if (ppNVar6 == (NAMED **)0x0) {
        table->size = 0;
        goto LAB_005f8629;
      }
      memset(ppNVar6,0,0x200);
      uVar4 = hash(parser,name);
      unaff_R15 = table->size - 1 & uVar4;
      bVar3 = true;
    }
    if (!bVar3) {
      return (NAMED *)0x0;
    }
    goto LAB_005f862f;
  }
  uVar4 = hash(parser,name);
  sVar15 = table->size;
  unaff_R15 = sVar15 - 1 & uVar4;
  pNVar5 = table->v[unaff_R15];
  if (pNVar5 != (NAMED *)0x0) {
    bVar13 = 0;
    do {
      if (*name == *pNVar5->name) {
        lVar14 = 1;
        cVar11 = *name;
        do {
          if (cVar11 == '\0') {
            bVar3 = false;
            goto LAB_005f861b;
          }
          cVar11 = name[lVar14];
          pcVar2 = pNVar5->name + lVar14;
          lVar14 = lVar14 + 1;
        } while (cVar11 == *pcVar2);
      }
      if (bVar13 == 0) {
        bVar13 = (byte)((-sVar15 & uVar4) >> ((char)*(undefined4 *)&table->power - 1U & 0x3f)) &
                 (byte)(sVar15 - 1 >> 2) | 1;
      }
      sVar12 = 0;
      if (unaff_R15 < bVar13) {
        sVar12 = sVar15;
      }
      unaff_R15 = (unaff_R15 - bVar13) + sVar12;
      pNVar5 = table->v[unaff_R15];
    } while (pNVar5 != (NAMED *)0x0);
  }
  if (createSize == 0) {
LAB_005f85c3:
    bVar3 = false;
LAB_005f85c5:
    pNVar5 = (NAMED *)0x0;
  }
  else {
    bVar13 = (byte)*(undefined4 *)&table->power;
    bVar3 = true;
    if (table->used >> (bVar13 - 1 & 0x3f) == 0) goto LAB_005f85c5;
    bVar9 = bVar13 + 1;
    if ((0x3f < bVar9) || (sVar15 = 1L << (bVar9 & 0x3f), 0x3c < bVar9)) goto LAB_005f85c3;
    sVar12 = 8L << (bVar9 & 0x3f);
    ppNVar6 = (NAMED **)(*table->mem->malloc_fcn)(sVar12);
    bVar3 = ppNVar6 != (NAMED **)0x0;
    if (ppNVar6 == (NAMED **)0x0) {
      pNVar5 = (NAMED *)0x0;
    }
    else {
      uVar1 = sVar15 - 1;
      memset(ppNVar6,0,sVar12);
      if (table->size != 0) {
        uVar16 = 0;
        do {
          if (table->v[uVar16] != (NAMED *)0x0) {
            uVar7 = hash(parser,table->v[uVar16]->name);
            uVar10 = uVar7 & uVar1;
            if (ppNVar6[uVar10] != (NAMED *)0x0) {
              bVar8 = 0;
              do {
                if (bVar8 == 0) {
                  bVar8 = (byte)((uVar7 & -sVar15) >> (bVar13 & 0x3f)) & (byte)(uVar1 >> 2) | 1;
                }
                sVar12 = 0;
                if (uVar10 < bVar8) {
                  sVar12 = sVar15;
                }
                uVar10 = (uVar10 - bVar8) + sVar12;
              } while (ppNVar6[uVar10] != (NAMED *)0x0);
            }
            ppNVar6[uVar10] = table->v[uVar16];
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < table->size);
      }
      (*table->mem->free_fcn)(table->v);
      table->v = ppNVar6;
      table->power = bVar9;
      table->size = sVar15;
      unaff_R15 = uVar1 & uVar4;
      if (ppNVar6[unaff_R15] != (NAMED *)0x0) {
        bVar9 = 0;
        do {
          if (bVar9 == 0) {
            bVar9 = (byte)((uVar4 & -sVar15) >> (bVar13 & 0x3f)) & (byte)(uVar1 >> 2) | 1;
          }
          sVar12 = 0;
          if (unaff_R15 < bVar9) {
            sVar12 = sVar15;
          }
          unaff_R15 = (unaff_R15 - bVar9) + sVar12;
        } while (ppNVar6[unaff_R15] != (NAMED *)0x0);
      }
      pNVar5 = (NAMED *)0x0;
      bVar3 = true;
    }
  }
LAB_005f861b:
  if (!bVar3) {
    return pNVar5;
  }
LAB_005f862f:
  pNVar5 = (NAMED *)(*table->mem->malloc_fcn)(createSize);
  table->v[unaff_R15] = pNVar5;
  if (table->v[unaff_R15] == (NAMED *)0x0) {
    return (NAMED *)0x0;
  }
  memset(table->v[unaff_R15],0,createSize);
  ppNVar6 = table->v;
  ppNVar6[unaff_R15]->name = name;
  table->used = table->used + 1;
  return ppNVar6[unaff_R15];
}

Assistant:

static NAMED *
lookup(XML_Parser parser, HASH_TABLE *table, KEY name, size_t createSize) {
  size_t i;
  if (table->size == 0) {
    size_t tsize;
    if (! createSize)
      return NULL;
    table->power = INIT_POWER;
    /* table->size is a power of 2 */
    table->size = (size_t)1 << INIT_POWER;
    tsize = table->size * sizeof(NAMED *);
    table->v = table->mem->malloc_fcn(tsize);
    if (! table->v) {
      table->size = 0;
      return NULL;
    }
    memset(table->v, 0, tsize);
    i = hash(parser, name) & ((unsigned long)table->size - 1);
  } else {
    unsigned long h = hash(parser, name);
    unsigned long mask = (unsigned long)table->size - 1;
    unsigned char step = 0;
    i = h & mask;
    while (table->v[i]) {
      if (keyeq(name, table->v[i]->name))
        return table->v[i];
      if (! step)
        step = PROBE_STEP(h, mask, table->power);
      i < step ? (i += table->size - step) : (i -= step);
    }
    if (! createSize)
      return NULL;

    /* check for overflow (table is half full) */
    if (table->used >> (table->power - 1)) {
      unsigned char newPower = table->power + 1;

      /* Detect and prevent invalid shift */
      if (newPower >= sizeof(unsigned long) * 8 /* bits per byte */) {
        return NULL;
      }

      size_t newSize = (size_t)1 << newPower;
      unsigned long newMask = (unsigned long)newSize - 1;

      /* Detect and prevent integer overflow */
      if (newSize > (size_t)(-1) / sizeof(NAMED *)) {
        return NULL;
      }

      size_t tsize = newSize * sizeof(NAMED *);
      NAMED **newV = table->mem->malloc_fcn(tsize);
      if (! newV)
        return NULL;
      memset(newV, 0, tsize);
      for (i = 0; i < table->size; i++)
        if (table->v[i]) {
          unsigned long newHash = hash(parser, table->v[i]->name);
          size_t j = newHash & newMask;
          step = 0;
          while (newV[j]) {
            if (! step)
              step = PROBE_STEP(newHash, newMask, newPower);
            j < step ? (j += newSize - step) : (j -= step);
          }
          newV[j] = table->v[i];
        }
      table->mem->free_fcn(table->v);
      table->v = newV;
      table->power = newPower;
      table->size = newSize;
      i = h & newMask;
      step = 0;
      while (table->v[i]) {
        if (! step)
          step = PROBE_STEP(h, newMask, newPower);
        i < step ? (i += newSize - step) : (i -= step);
      }
    }
  }
  table->v[i] = table->mem->malloc_fcn(createSize);
  if (! table->v[i])
    return NULL;
  memset(table->v[i], 0, createSize);
  table->v[i]->name = name;
  (table->used)++;
  return table->v[i];
}